

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

size_t anon_unknown.dwarf_65b687::cmWriteToMemoryCallback
                 (void *ptr,size_t size,size_t nmemb,void *data)

{
  int iVar1;
  char *chPtr;
  int realsize;
  void *data_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  iVar1 = (int)size * (int)nmemb;
  cmAppend<char,char_const*>
            ((vector<char,_std::allocator<char>_> *)data,(char *)ptr,
             (char *)((long)ptr + (long)iVar1));
  return (long)iVar1;
}

Assistant:

size_t cmWriteToMemoryCallback(void* ptr, size_t size, size_t nmemb,
                               void* data)
{
  int realsize = static_cast<int>(size * nmemb);
  const char* chPtr = static_cast<char*>(ptr);
  cmAppend(*static_cast<cmFileCommandVectorOfChar*>(data), chPtr,
           chPtr + realsize);
  return realsize;
}